

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  string usedVersion;
  string requiredVersion;
  allocator local_71;
  string local_70;
  string local_50 [32];
  string local_30;
  
  std::__cxx11::string::string(local_50,"1.3",(allocator *)&local_70);
  cmGlobalNinjaGenerator::ninjaVersion_abi_cxx11_
            (&local_70,(cmGlobalNinjaGenerator *)(this->super_cmLocalGenerator).GlobalGenerator);
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,local_70._M_dataplus._M_p,"1.5");
  if (!bVar1) {
    std::__cxx11::string::assign((char *)local_50);
  }
  std::__cxx11::string::string
            ((string *)&local_30,"Minimal version of Ninja required by this file",&local_71);
  cmGlobalNinjaGenerator::WriteComment(os,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar2 = std::operator<<(os,"ninja_required_version = ");
  poVar2 = std::operator<<(poVar2,local_50);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  // Ninja generator uses 'deps' and 'msvc_deps_prefix' introduced in 1.3
  std::string requiredVersion = "1.3";

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  std::string usedVersion = this->GetGlobalNinjaGenerator()->ninjaVersion();
  if(cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                   usedVersion.c_str(),
                                   "1.5") ==  false)
    {
      requiredVersion = "1.5";
    }

  cmGlobalNinjaGenerator::WriteComment(os,
                          "Minimal version of Ninja required by this file");
  os
    << "ninja_required_version = "
    << requiredVersion
    << std::endl << std::endl
    ;
}